

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_skip_jp2c(opj_jp2_t *jp2,opj_stream_private_t *stream,opj_event_mgr_t *p_manager)

{
  OPJ_OFF_T OVar1;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *stream_local;
  opj_jp2_t *jp2_local;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0xa55,
                  "OPJ_BOOL opj_jp2_skip_jp2c(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (stream != (opj_stream_private_t *)0x0) {
    if (p_manager != (opj_event_mgr_t *)0x0) {
      OVar1 = opj_stream_tell(stream);
      jp2->j2k_codestream_offset = OVar1;
      OVar1 = opj_stream_skip(stream,8,p_manager);
      jp2_local._4_4_ = (uint)(OVar1 == 8);
      return jp2_local._4_4_;
    }
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0xa57,
                  "OPJ_BOOL opj_jp2_skip_jp2c(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  __assert_fail("stream != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                ,0xa56,
                "OPJ_BOOL opj_jp2_skip_jp2c(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_skip_jp2c(opj_jp2_t *jp2,
                                  opj_stream_private_t *stream,
                                  opj_event_mgr_t * p_manager)
{
    /* preconditions */
    assert(jp2 != 00);
    assert(stream != 00);
    assert(p_manager != 00);

    jp2->j2k_codestream_offset = opj_stream_tell(stream);

    if (opj_stream_skip(stream, 8, p_manager) != 8) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}